

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O2

errr Term_redraw_section(wchar_t x1,wchar_t y1,wchar_t x2,wchar_t y2)

{
  term_win *ptVar1;
  wchar_t *pwVar2;
  term *ptVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  ulong uVar6;
  wchar_t wVar7;
  long lVar8;
  
  ptVar3 = Term;
  wVar7 = Term->hgt + L'\xffffffff';
  if (y2 < Term->hgt) {
    wVar7 = y2;
  }
  wVar4 = Term->wid + L'\xffffffff';
  if (x2 < Term->wid) {
    wVar4 = x2;
  }
  uVar6 = (ulong)(uint)y1;
  if (y1 < L'\x01') {
    uVar6 = 0;
  }
  wVar5 = L'\0';
  if (L'\0' < x1) {
    wVar5 = x1;
  }
  Term->y1 = (int)uVar6;
  ptVar3->y2 = wVar7;
  for (; (long)uVar6 <= (long)wVar7; uVar6 = uVar6 + 1) {
    ptVar1 = ptVar3->old;
    if (L'\0' < wVar5) {
      wVar5 = wVar5 - (uint)(ptVar1->a[uVar6][(uint)wVar5] == 0xff);
    }
    ptVar3->x1[uVar6] = wVar5;
    ptVar3->x2[uVar6] = wVar4;
    pwVar2 = ptVar1->c[uVar6];
    for (lVar8 = (long)wVar5; lVar8 <= wVar4; lVar8 = lVar8 + 1) {
      pwVar2[lVar8] = L'\0';
    }
    wVar7 = ptVar3->y2;
  }
  Term_fresh();
  return 0;
}

Assistant:

errr Term_redraw_section(int x1, int y1, int x2, int y2)
{
	int i, j;

	wchar_t *c_ptr;

	/* Bounds checking */
	if (y2 >= Term->hgt) y2 = Term->hgt - 1;
	if (x2 >= Term->wid) x2 = Term->wid - 1;
	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;


	/* Set y limits */
	Term->y1 = y1;
	Term->y2 = y2;

	/* Set the x limits */
	for (i = Term->y1; i <= Term->y2; i++) {
		if ((x1 > 0) && (Term->old->a[i][x1] == 255))
			x1--;

		Term->x1[i] = x1;
		Term->x2[i] = x2;

		c_ptr = Term->old->c[i];

		/* Clear the section so it is redrawn */
		for (j = x1; j <= x2; j++) {
			/* Hack - set the old character to "none" */
			c_ptr[j] = 0;
		}
	}

	/* Hack -- Refresh */
	Term_fresh();

	/* Success */
	return (0);
}